

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O0

RWNode * __thiscall
dg::dda::MemorySSATransformation::insertUse
          (MemorySSATransformation *this,RWNode *where,RWNode *mem,Offset *off,Offset *len)

{
  RWNode *before;
  BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode> *in_RCX;
  RWNode *in_RDX;
  RWNode *in_RSI;
  RWNode *in_R8;
  RWNode *use;
  RWNode *in_stack_ffffffffffffffb8;
  Offset in_stack_ffffffffffffffc0;
  
  before = ReadWriteGraph::create((ReadWriteGraph *)in_RCX,(RWNodeType)((ulong)in_R8 >> 0x20));
  GenericDefSite<dg::dda::RWNode>::GenericDefSite
            ((GenericDefSite<dg::dda::RWNode> *)&stack0xffffffffffffffb8,in_RDX,(Offset *)in_RCX,
             (Offset *)in_R8);
  RWNode::addUse((RWNode *)in_stack_ffffffffffffffc0.offset,(DefSite *)in_stack_ffffffffffffffb8);
  SubgraphNode<dg::dda::RWNode>::insertBefore((SubgraphNode<dg::dda::RWNode> *)in_RSI,in_RDX);
  RWNode::getBBlock(in_RSI);
  BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::insertBefore(in_RCX,in_R8,before);
  return before;
}

Assistant:

RWNode *MemorySSATransformation::insertUse(RWNode *where, RWNode *mem,
                                           const Offset &off,
                                           const Offset &len) {
    // DBG_SECTION_BEGIN(dda, "Adding MU node");
    auto &use = graph.create(RWNodeType::MU);
    use.addUse({mem, off, len});
    use.insertBefore(where);
    where->getBBlock()->insertBefore(&use, where);
    // DBG_SECTION_END(dda, "Created MU node " << use->getID());

    return &use;
}